

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O0

int kvtree_close_with_unlock(char *file,int fd)

{
  int ret;
  int fd_local;
  char *file_local;
  
  file_local._4_4_ = kvtree_file_unlock(file,fd);
  if (file_local._4_4_ == 0) {
    file_local._4_4_ = kvtree_close(file,fd);
  }
  return file_local._4_4_;
}

Assistant:

int kvtree_close_with_unlock(const char* file, int fd)
{
  /* release the file lock */
  int ret = kvtree_file_unlock(file, fd);
  if (ret != KVTREE_SUCCESS) {
    return ret;
  }

  /* close the file */
  return kvtree_close(file, fd);
}